

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerTest.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_31d0::LexerTest_identifierKeywords_Test::~LexerTest_identifierKeywords_Test
          (LexerTest_identifierKeywords_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(LexerTest, identifierKeywords) {
  StringRef input = "notakeyword build default include \
pool rule subninja";
  ninja::Lexer lexer(input);
  ninja::Token tok;

  // Check first token.
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::Identifier, tok.tokenKind);
  EXPECT_EQ(0, memcmp(tok.start, "notakeyword", tok.length));

  // Check the various keywords.
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::KWBuild, tok.tokenKind);
  EXPECT_EQ(0, memcmp(tok.start, "build", tok.length));
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::KWDefault, tok.tokenKind);
  EXPECT_EQ(0, memcmp(tok.start, "default", tok.length));
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::KWInclude, tok.tokenKind);
  EXPECT_EQ(0, memcmp(tok.start, "include", tok.length));
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::KWPool, tok.tokenKind);
  EXPECT_EQ(0, memcmp(tok.start, "pool", tok.length));
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::KWRule, tok.tokenKind);
  EXPECT_EQ(0, memcmp(tok.start, "rule", tok.length));
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::KWSubninja, tok.tokenKind);
  EXPECT_EQ(0, memcmp(tok.start, "subninja", tok.length));

  // Check final token.
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::EndOfFile, tok.tokenKind);
}